

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O2

double __thiscall FeeFilterRounder::round(FeeFilterRounder *this,double __x)

{
  const_iterator cVar1;
  uint64_t uVar2;
  long in_RSI;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar3;
  unique_lock<std::mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30._M_device = (mutex_type *)(double)in_RSI;
  cVar1 = std::
          _Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>
          ::lower_bound((_Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>
                         *)this,(key_type_conflict5 *)&local_30);
  if ((_Rb_tree_header *)cVar1._M_node != &(this->m_fee_set)._M_t._M_impl.super__Rb_tree_header) {
    dVar3 = extraout_XMM0_Qa;
    if (cVar1._M_node == (this->m_fee_set)._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
    goto LAB_007c54ac;
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&local_30,&this->m_insecure_rand_mutex,
               "m_insecure_rand_mutex",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp"
               ,0x44a,false);
    uVar2 = RandomMixin<FastRandomContext>::randbits<32>
                      (&this->insecure_rand->super_RandomMixin<FastRandomContext>);
    std::unique_lock<std::mutex>::~unique_lock(&local_30);
    dVar3 = extraout_XMM0_Qa_00;
    if ((int)((uVar2 & 0xffffffff) % 3) == 0) goto LAB_007c54ac;
  }
  dVar3 = (double)std::_Rb_tree_decrement((_Rb_tree_node_base *)cVar1._M_node);
LAB_007c54ac:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return dVar3;
  }
  __stack_chk_fail();
}

Assistant:

CAmount FeeFilterRounder::round(CAmount currentMinFee)
{
    AssertLockNotHeld(m_insecure_rand_mutex);
    std::set<double>::iterator it = m_fee_set.lower_bound(currentMinFee);
    if (it == m_fee_set.end() ||
        (it != m_fee_set.begin() &&
         WITH_LOCK(m_insecure_rand_mutex, return insecure_rand.rand32()) % 3 != 0)) {
        --it;
    }
    return static_cast<CAmount>(*it);
}